

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::
make_next_inequality_node(branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *this)

{
  pointer *ppnVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer pnVar5;
  pointer piVar6;
  pointer pcVar7;
  size_type sVar8;
  reference pvVar9;
  ulong uVar10;
  ptrdiff_t _Num;
  uint level;
  uint local_30;
  int local_2c;
  longdouble local_28;
  
  pnVar5 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = pnVar5[-1].level;
  local_30 = uVar2 + 1;
  uVar3 = (this->subvector).m_element_size;
  if (local_30 < uVar3) {
    pnVar5[-1].level = local_30;
    local_28 = pnVar5[-1].sumr;
    pnVar5[-1].z = local_28;
    if (uVar2 + 2 < uVar3) {
      pnVar5[-1].z = (this->items).
                     super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2 + 2].sum_z + local_28;
    }
    uVar2 = pnVar5[-1].variables;
    piVar6 = (this->items).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_28 = piVar6[local_30].r + local_28;
    local_2c = pnVar5[-1].sumfactor + piVar6[local_30].factor;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::node>>
             ::emplace_back<long_double,int,unsigned_int_const&>
                       ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::node>>
                         *)&this->nodes,&local_28,&local_2c,&local_30);
    sVar8 = shared_subvector::emplace(&this->subvector);
    pvVar9->variables = sVar8;
    uVar10 = (ulong)(this->subvector).m_element_size;
    if (uVar10 != 0) {
      pcVar7 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar7 + sVar8,pcVar7 + uVar2,uVar10);
    }
    uVar10 = (ulong)(local_30 + pvVar9->variables);
    pcVar7 = (this->subvector).m_container.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->subvector).m_container.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar7) <= uVar10) {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::make_next_inequality_node();
    }
    pcVar7[uVar10] = '\x01';
    uVar3 = (this->subvector).m_element_size;
    if (local_30 + 1 < uVar3) {
      pvVar9->z = (this->items).
                  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_30 + 1].sum_z + pvVar9->sumr;
    }
    iVar4 = pvVar9->sumfactor;
    if (iVar4 <= this->b_max && this->b_min <= iVar4) {
      if (this->lower_bound <= pvVar9->sumr) {
        return;
      }
      if ((ulong)uVar3 != 0) {
        pcVar7 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar7 + this->solution,pcVar7 + uVar2,(ulong)uVar3);
      }
      local_30 = local_30 + this->solution;
      pcVar7 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar7[local_30] = pcVar7[local_30] == '\0';
      this->lower_bound =
           (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].sumr;
      return;
    }
    if (iVar4 <= this->b_max) {
      return;
    }
    uVar2 = pvVar9->variables;
  }
  else {
    uVar2 = pnVar5[-1].variables;
  }
  shared_subvector::check_index(&this->subvector,uVar2);
  *(size_type *)
   ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start + uVar2) = (this->subvector).m_free_list_head;
  (this->subvector).m_free_list_head = uVar2;
  ppnVar1 = &(this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppnVar1 = *ppnVar1 + -1;
  return;
}

Assistant:

void make_next_inequality_node()
    {
        node& node_0 = nodes.back();

        const unsigned level = node_0.level + 1;
        if (level >= subvector.element_size()) {
            subvector.remove(node_0.variables);
            nodes.pop_back();
            return;
        }

        node_0.level = level;
        node_0.z = node_0.sumr;

        if (level + 1 < subvector.element_size())
            node_0.z += items[level + 1].sum_z;

        const Float sumr = node_0.sumr;
        const int sumfactor = node_0.sumfactor;
        const unsigned int variables = node_0.variables;

        node& node_1 = nodes.emplace_back(
          sumr + items[level].r, sumfactor + items[level].factor, level);
        node_1.variables = subvector.emplace();
        subvector.copy(variables, node_1.variables);
        subvector[node_1.variables + level] = 1;
        if (level + 1 < subvector.element_size())
            node_1.z = node_1.sumr + items[level + 1].sum_z;

        if (b_min <= node_1.sumfactor && node_1.sumfactor <= b_max) {
            if (is_best_solution(node_1.sumr)) {
                subvector.copy(variables, solution);
                subvector.invert(solution, level);
                lower_bound = nodes.back().sumr;
            }
        } else if (node_1.sumfactor > b_max) {
            subvector.remove(node_1.variables);
            nodes.pop_back();
        }
    }